

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::WriteTableRecord(Table *table,size_t *offset,uint8_t *dst,size_t dst_size)

{
  bool bVar1;
  size_t dst_size_local;
  uint8_t *dst_local;
  size_t *offset_local;
  Table *table_local;
  
  if (dst_size < *offset + 0x10) {
    table_local._7_1_ = false;
  }
  else {
    bVar1 = Font::Table::IsReused(table);
    offset_local = (size_t *)table;
    if (bVar1) {
      offset_local = (size_t *)table->reuse_of;
    }
    StoreU32((uint32_t)*offset_local,offset,dst);
    StoreU32(*(uint32_t *)((long)offset_local + 4),offset,dst);
    StoreU32((uint32_t)offset_local[1],offset,dst);
    StoreU32(*(uint32_t *)((long)offset_local + 0xc),offset,dst);
    table_local._7_1_ = true;
  }
  return table_local._7_1_;
}

Assistant:

bool WriteTableRecord(const Font::Table* table, size_t* offset, uint8_t* dst,
                      size_t dst_size) {
  if (dst_size < *offset + kSfntEntrySize) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (table->IsReused()) {
    table = table->reuse_of;
  }
  StoreU32(table->tag, offset, dst);
  StoreU32(table->checksum, offset, dst);
  StoreU32(table->offset, offset, dst);
  StoreU32(table->length, offset, dst);
  return true;
}